

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeSignedLdStInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t local_40;
  int32_t offset;
  uint Rn;
  uint Rt;
  _Bool IsFP;
  _Bool IsIndexed;
  _Bool IsLoad;
  void *Decoder_local;
  uint64_t Addr_local;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  RegNo = fieldFromInstruction(insn,0,5);
  RegNo_00 = fieldFromInstruction(insn,5,5);
  local_40 = fieldFromInstruction(insn,0xc,9);
  if ((local_40 & 0x100) != 0) {
    local_40 = local_40 | 0xfffffe00;
  }
  uVar1 = MCInst_getOpcode(Inst);
  if ((((((uVar1 - 0x3c4 < 2) || (uVar1 - 0x3c9 < 2)) || (uVar1 - 0x3cf < 2)) ||
       (((uVar1 - 0x3d4 < 2 || (uVar1 - 0x3d9 < 2)) ||
        ((uVar1 - 0x3df < 2 || ((uVar1 - 0x3e4 < 2 || (uVar1 - 0x3e9 < 2)))))))) ||
      ((uVar1 - 0x3ee < 2 ||
       (((((((uVar1 - 0x3f3 < 2 || (uVar1 - 0x3f9 < 2)) || (uVar1 - 0x3ff < 2)) ||
           ((uVar1 - 0x405 < 2 || (uVar1 - 0x40b < 2)))) || (uVar1 - 0x755 < 2)) ||
         ((uVar1 - 0x75a < 2 || (uVar1 - 0x75f < 2)))) ||
        ((uVar1 - 0x764 < 2 || (((uVar1 - 0x769 < 2 || (uVar1 - 0x76e < 2)) || (uVar1 - 0x773 < 2)))
         ))))))) || ((uVar1 - 0x778 < 2 || (uVar1 - 0x77d < 2)))) {
    DecodeGPR64spRegisterClass(Inst,RegNo_00,Addr,Decoder);
  }
  uVar1 = MCInst_getOpcode(Inst);
  if (uVar1 - 0x3c4 < 2) goto LAB_001a743b;
  if (uVar1 - 0x3c9 < 2) goto LAB_001a74c2;
  if (uVar1 - 0x3cf < 2) goto LAB_001a7480;
  if (uVar1 - 0x3d4 < 2) goto LAB_001a743b;
  if (uVar1 - 0x3d9 < 2) goto LAB_001a74ac;
  if (uVar1 - 0x3df < 2) goto LAB_001a746a;
  if (1 < uVar1 - 0x3e4) {
    if (uVar1 - 0x3e9 < 2) {
LAB_001a7454:
      DecodeGPR64RegisterClass(Inst,RegNo,Addr,Decoder);
      goto LAB_001a74d6;
    }
    if (1 < uVar1 - 0x3ee) {
      if ((uVar1 - 0x3f3 < 2) || (uVar1 - 0x3f9 < 2)) goto LAB_001a7454;
      if (uVar1 - 0x3ff < 2) goto LAB_001a7496;
      if (1 < uVar1 - 0x405) {
        if (uVar1 - 0x40b < 2) goto LAB_001a7454;
        if (2 < uVar1 - 0x410) {
          if (uVar1 == 0x413) goto LAB_001a7454;
          if (uVar1 != 0x414) {
            if (uVar1 - 0x415 < 2) goto LAB_001a7454;
            if (uVar1 != 0x417) {
              if (uVar1 == 0x418) goto LAB_001a7454;
              if (uVar1 != 0x419) {
                if (uVar1 == 0x41a) goto LAB_001a74c2;
                if (uVar1 == 0x41b) goto LAB_001a7480;
                if (uVar1 == 0x41c) goto LAB_001a743b;
                if (uVar1 == 0x41d) goto LAB_001a74ac;
                if (uVar1 == 0x41e) goto LAB_001a746a;
                if (uVar1 != 0x41f) {
                  if (uVar1 == 0x420) goto LAB_001a7454;
                  if (uVar1 != 0x421) {
                    if (uVar1 - 0x422 < 2) goto LAB_001a7454;
                    if (uVar1 == 0x424) {
LAB_001a7496:
                      DecodeFPR32RegisterClass(Inst,RegNo,Addr,Decoder);
                      goto LAB_001a74d6;
                    }
                    if (uVar1 == 0x425) goto LAB_001a743b;
                    if (uVar1 == 0x426) goto LAB_001a7454;
                    if (uVar1 == 0x49b) {
                      MCOperand_CreateImm0(Inst,(ulong)RegNo);
                      goto LAB_001a74d6;
                    }
                    if (uVar1 - 0x755 < 2) goto LAB_001a743b;
                    if (uVar1 - 0x75a < 2) {
LAB_001a74c2:
                      DecodeFPR8RegisterClass(Inst,RegNo,Addr,Decoder);
                      goto LAB_001a74d6;
                    }
                    if (uVar1 - 0x75f < 2) {
LAB_001a7480:
                      DecodeFPR64RegisterClass(Inst,RegNo,Addr,Decoder);
                      goto LAB_001a74d6;
                    }
                    if (uVar1 - 0x764 < 2) goto LAB_001a743b;
                    if (uVar1 - 0x769 < 2) {
LAB_001a74ac:
                      DecodeFPR16RegisterClass(Inst,RegNo,Addr,Decoder);
                      goto LAB_001a74d6;
                    }
                    if (uVar1 - 0x76e < 2) {
LAB_001a746a:
                      DecodeFPR128RegisterClass(Inst,RegNo,Addr,Decoder);
                      goto LAB_001a74d6;
                    }
                    if (uVar1 - 0x773 < 2) goto LAB_001a7496;
                    if (1 < uVar1 - 0x778) {
                      if (uVar1 - 0x77d < 2) goto LAB_001a7454;
                      if (2 < uVar1 - 0x782) {
                        if (uVar1 == 0x785) goto LAB_001a7454;
                        if (uVar1 != 0x786) {
                          if (uVar1 == 0x787) goto LAB_001a74c2;
                          if (uVar1 == 0x788) goto LAB_001a7480;
                          if (uVar1 != 0x789) {
                            if (uVar1 == 0x78a) goto LAB_001a74ac;
                            if (uVar1 == 0x78b) goto LAB_001a746a;
                            if (uVar1 == 0x78c) goto LAB_001a7496;
                            if (uVar1 != 0x78d) {
                              if (uVar1 != 0x78e) {
                                return MCDisassembler_Fail;
                              }
                              goto LAB_001a7454;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001a743b:
  DecodeGPR32RegisterClass(Inst,RegNo,Addr,Decoder);
LAB_001a74d6:
  DecodeGPR64spRegisterClass(Inst,RegNo_00,Addr,Decoder);
  MCOperand_CreateImm0(Inst,(long)(int)local_40);
  uVar2 = fieldFromInstruction(insn,0x16,1);
  uVar3 = fieldFromInstruction(insn,10,2);
  uVar4 = fieldFromInstruction(insn,0x1a,1);
  if ((((uVar2 == 0) || (uVar3 == 0)) || (uVar4 != 0)) ||
     ((RegNo_00 == 0x1f || (RegNo != RegNo_00)))) {
    Inst_local._4_4_ = MCDisassembler_Success;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_SoftFail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeSignedLdStInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
	bool IsLoad;
	bool IsIndexed;
	bool IsFP;
	unsigned Rt = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	int32_t offset = fieldFromInstruction(insn, 12, 9);

	// offset is a 9-bit signed immediate, so sign extend it to
	// fill the unsigned.
	if (offset & (1 << (9 - 1)))
		offset |= ~((1LL << 9) - 1);

	// First operand is always the writeback to the address register, if needed.
	switch (MCInst_getOpcode(Inst)) {
		default:
			break;
		case AArch64_LDRSBWpre:
		case AArch64_LDRSHWpre:
		case AArch64_STRBBpre:
		case AArch64_LDRBBpre:
		case AArch64_STRHHpre:
		case AArch64_LDRHHpre:
		case AArch64_STRWpre:
		case AArch64_LDRWpre:
		case AArch64_LDRSBWpost:
		case AArch64_LDRSHWpost:
		case AArch64_STRBBpost:
		case AArch64_LDRBBpost:
		case AArch64_STRHHpost:
		case AArch64_LDRHHpost:
		case AArch64_STRWpost:
		case AArch64_LDRWpost:
		case AArch64_LDRSBXpre:
		case AArch64_LDRSHXpre:
		case AArch64_STRXpre:
		case AArch64_LDRSWpre:
		case AArch64_LDRXpre:
		case AArch64_LDRSBXpost:
		case AArch64_LDRSHXpost:
		case AArch64_STRXpost:
		case AArch64_LDRSWpost:
		case AArch64_LDRXpost:
		case AArch64_LDRQpre:
		case AArch64_STRQpre:
		case AArch64_LDRQpost:
		case AArch64_STRQpost:
		case AArch64_LDRDpre:
		case AArch64_STRDpre:
		case AArch64_LDRDpost:
		case AArch64_STRDpost:
		case AArch64_LDRSpre:
		case AArch64_STRSpre:
		case AArch64_LDRSpost:
		case AArch64_STRSpost:
		case AArch64_LDRHpre:
		case AArch64_STRHpre:
		case AArch64_LDRHpost:
		case AArch64_STRHpost:
		case AArch64_LDRBpre:
		case AArch64_STRBpre:
		case AArch64_LDRBpost:
		case AArch64_STRBpost:
			DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
			break;
	}

	switch (MCInst_getOpcode(Inst)) {
		default:
			return Fail;
		case AArch64_PRFUMi:
			// Rt is an immediate in prefetch.
			MCOperand_CreateImm0(Inst, Rt);
			break;
		case AArch64_STURBBi:
		case AArch64_LDURBBi:
		case AArch64_LDURSBWi:
		case AArch64_STURHHi:
		case AArch64_LDURHHi:
		case AArch64_LDURSHWi:
		case AArch64_STURWi:
		case AArch64_LDURWi:
		case AArch64_LDTRSBWi:
		case AArch64_LDTRSHWi:
		case AArch64_STTRWi:
		case AArch64_LDTRWi:
		case AArch64_STTRHi:
		case AArch64_LDTRHi:
		case AArch64_LDTRBi:
		case AArch64_STTRBi:
		case AArch64_LDRSBWpre:
		case AArch64_LDRSHWpre:
		case AArch64_STRBBpre:
		case AArch64_LDRBBpre:
		case AArch64_STRHHpre:
		case AArch64_LDRHHpre:
		case AArch64_STRWpre:
		case AArch64_LDRWpre:
		case AArch64_LDRSBWpost:
		case AArch64_LDRSHWpost:
		case AArch64_STRBBpost:
		case AArch64_LDRBBpost:
		case AArch64_STRHHpost:
		case AArch64_LDRHHpost:
		case AArch64_STRWpost:
		case AArch64_LDRWpost:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURSBXi:
		case AArch64_LDURSHXi:
		case AArch64_LDURSWi:
		case AArch64_STURXi:
		case AArch64_LDURXi:
		case AArch64_LDTRSBXi:
		case AArch64_LDTRSHXi:
		case AArch64_LDTRSWi:
		case AArch64_STTRXi:
		case AArch64_LDTRXi:
		case AArch64_LDRSBXpre:
		case AArch64_LDRSHXpre:
		case AArch64_STRXpre:
		case AArch64_LDRSWpre:
		case AArch64_LDRXpre:
		case AArch64_LDRSBXpost:
		case AArch64_LDRSHXpost:
		case AArch64_STRXpost:
		case AArch64_LDRSWpost:
		case AArch64_LDRXpost:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURQi:
		case AArch64_STURQi:
		case AArch64_LDRQpre:
		case AArch64_STRQpre:
		case AArch64_LDRQpost:
		case AArch64_STRQpost:
			DecodeFPR128RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURDi:
		case AArch64_STURDi:
		case AArch64_LDRDpre:
		case AArch64_STRDpre:
		case AArch64_LDRDpost:
		case AArch64_STRDpost:
			DecodeFPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURSi:
		case AArch64_STURSi:
		case AArch64_LDRSpre:
		case AArch64_STRSpre:
		case AArch64_LDRSpost:
		case AArch64_STRSpost:
			DecodeFPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURHi:
		case AArch64_STURHi:
		case AArch64_LDRHpre:
		case AArch64_STRHpre:
		case AArch64_LDRHpost:
		case AArch64_STRHpost:
			DecodeFPR16RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURBi:
		case AArch64_STURBi:
		case AArch64_LDRBpre:
		case AArch64_STRBpre:
		case AArch64_LDRBpost:
		case AArch64_STRBpost:
			DecodeFPR8RegisterClass(Inst, Rt, Addr, Decoder);
			break;
	}

	DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
	MCOperand_CreateImm0(Inst, offset);

	IsLoad = fieldFromInstruction(insn, 22, 1);
	IsIndexed = fieldFromInstruction(insn, 10, 2) != 0;
	IsFP = fieldFromInstruction(insn, 26, 1);

	// Cannot write back to a transfer register (but xzr != sp).
	if (IsLoad && IsIndexed && !IsFP && Rn != 31 && Rt == Rn)
		return SoftFail;

	return Success;
}